

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

void __thiscall merlin::factor::factor(factor *this,value s)

{
  allocator_type local_19;
  value s_local;
  
  this->_vptr_factor = (_func_int **)&PTR__factor_00197548;
  (this->v_).m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_).m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->v_).m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->v_).m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_).m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->v_).m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->v_).m_d = (vsize *)0x0;
  s_local = s;
  std::vector<double,_std::allocator<double>_>::vector(&this->t_,1,&s_local,&local_19);
  this->c_ = -1;
  return;
}

Assistant:

factor(const value s = 1.0) :
			v_(), t_(1, s), c_(-1) {
	}